

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

void AddLookup(nodeclass *Class,nodemeta *m,array *List)

{
  uint uVar1;
  nodemetalookup Lookup;
  bool_t Found;
  
  Lookup.Id = (dataid)(*(uint *)m >> 8);
  Lookup.Meta = (nodemeta *)0x0;
  if (List == (array *)0x0) {
    __assert_fail("&(*List)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x40f,"void AddLookup(nodeclass *, const nodemeta *, array *)");
  }
  ArrayFindEx(List,List->_Used >> 4,0x10,&Lookup,CmpLookup,(void *)0x0,&Found);
  uVar1 = *(uint *)m & 0xff;
  if (Found == 0) {
    if (uVar1 == 0x58) {
      do {
        if (Class == (nodeclass *)0x0) {
          Lookup.Meta = (nodemeta *)0x0;
          __assert_fail("Lookup.Meta",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x415,"void AddLookup(nodeclass *, const nodemeta *, array *)");
        }
        Lookup.Meta = Class->Meta;
        if (Lookup.Meta != (nodemeta *)0x0) {
          while( true ) {
            uVar1 = *(uint *)Lookup.Meta & 0xff;
            if (uVar1 == 0) break;
            if (uVar1 == 0x26 && (*(uint *)Lookup.Meta ^ *(uint *)m) < 0x100) {
              ArrayAddEx(List,List->_Used >> 4,0x10,&Lookup,CmpLookup,(void *)0x0,0);
              goto LAB_0010e77a;
            }
            Lookup.Meta = Lookup.Meta + 1;
          }
        }
        Class = Class->ParentClass;
      } while( true );
    }
  }
  else if (uVar1 != 0x2d) {
    return;
  }
LAB_0010e77a:
  Lookup.Meta = m;
  ArrayAddEx(List,List->_Used >> 4,0x10,&Lookup,CmpLookup,&Lookup,0);
  return;
}

Assistant:

static NOINLINE void AddLookup(nodeclass* Class, const nodemeta* m, array* List)
{
    bool_t Found;
    nodemetalookup Lookup;
    Lookup.Id = m->Id;
    Lookup.Meta = NULL;
    ArrayFind(List,nodemetalookup,&Lookup,CmpLookup,NULL,&Found);
    if (!Found || m->Meta == META_PARAM_EVENT)
    {
        if ((m->Meta & META_MODE_MASK)==META_MODE_DATA && (m->Meta & TYPE_MASK)==TYPE_BOOL_BIT)
        {
            Lookup.Meta = BitLookup(Class,m->Id);
            assert(Lookup.Meta);
            if (!Lookup.Meta)
                return;
            ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,NULL,0);
        }
        Lookup.Meta = m;
        ArrayAdd(List,nodemetalookup,&Lookup,CmpLookup,&Lookup,0);
    }
}